

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

int fmt::v8::detail::format_float<long_double>
              (longdouble value,int precision,float_specs specs,buffer<char> *buf)

{
  int iVar1;
  ulong uVar2;
  decimal_fp<float> dVar3;
  uint uVar4;
  ulong uVar5;
  detail *this;
  size_t sVar6;
  uint uVar7;
  fp value_00;
  decimal_fp<double> dVar8;
  int exp;
  int *in_stack_ffffffffffffffb8;
  int local_34;
  float local_30;
  float local_2c;
  double local_28;
  
  if (value < (longdouble)0) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/fmt-src/include/fmt/format-inl.h"
                ,0x929,"value is negative");
  }
  if (value <= (longdouble)0) {
    if (precision < 1 || ((ulong)specs & 0xff00000000) != 0x200000000) {
      if (buf->capacity_ < buf->size_ + 1) {
        (**buf->_vptr_buffer)(buf);
      }
      sVar6 = buf->size_;
      buf->size_ = sVar6 + 1;
      buf->ptr_[sVar6] = '0';
      local_34 = 0;
    }
    else {
      uVar5 = (ulong)(uint)precision;
      if (buf->capacity_ < uVar5) {
        (**buf->_vptr_buffer)(buf,uVar5);
      }
      uVar2 = buf->capacity_;
      if (uVar5 <= buf->capacity_) {
        uVar2 = uVar5;
      }
      buf->size_ = uVar2;
      if (precision < 0) {
        assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/fmt-src/include/fmt/core.h"
                    ,0x1aa,"negative value");
      }
      memset(buf->ptr_,0x30,uVar5);
      local_34 = -precision;
    }
  }
  else {
    uVar7 = specs._4_4_;
    if ((uVar7 >> 0x13 & 1) == 0) {
      if (precision < 0) {
        if ((uVar7 >> 0x12 & 1) == 0) {
          local_28 = (double)value;
          dVar8 = dragonbox::to_decimal<double>(local_28);
          write<char,_fmt::v8::appender,_unsigned_long,_0>((appender)buf,dVar8.significand);
          local_34 = dVar8.exponent;
        }
        else {
          local_30 = (float)value;
          dVar3 = dragonbox::to_decimal<float>(local_30);
          write<char,_fmt::v8::appender,_unsigned_int,_0>((appender)buf,dVar3.significand);
          local_34 = dVar3.exponent;
        }
      }
      else {
        local_34 = 0;
        if ((uVar7 >> 0x12 & 1) == 0) {
          assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/fmt-src/include/fmt/format-inl.h"
                      ,0x11a,"");
        }
        local_2c = (float)value;
        uVar4 = (uint)local_2c & 0x7fffff;
        this = (detail *)(ulong)uVar4 + 0x800000;
        if ((uint)local_2c < 0x800000) {
          this = (detail *)(ulong)uVar4;
        }
        uVar5 = 0xffffff6b;
        if ((uint)local_2c >= 0x800000) {
          uVar5 = (ulong)(((uint)local_2c >> 0x17) - 0x96);
        }
        iVar1 = 0x2ff;
        if (precision < 0x2ff) {
          iVar1 = precision;
        }
        value_00.e._0_1_ = 0xffffff < (uint)local_2c && uVar4 == 0;
        value_00.f = uVar5;
        value_00._9_7_ = 0;
        format_dragon(this,value_00,SUB41(iVar1,0),(int)buf,(buffer<char> *)&local_34,
                      in_stack_ffffffffffffffb8);
        if (((ulong)specs & 0xff00000000) != 0x200000000 && (uVar7 >> 0x14 & 1) == 0) {
          sVar6 = buf->size_;
          if (sVar6 != 0) {
            do {
              iVar1 = local_34 + 1;
              if (buf->ptr_[sVar6 - 1] != '0') goto LAB_0011614e;
              sVar6 = sVar6 - 1;
              local_34 = iVar1;
            } while (sVar6 != 0);
            sVar6 = 0;
          }
LAB_0011614e:
          if (buf->capacity_ < sVar6) {
            (**buf->_vptr_buffer)(buf,sVar6);
          }
          if (buf->capacity_ < sVar6) {
            sVar6 = buf->capacity_;
          }
          buf->size_ = sVar6;
        }
      }
    }
    else {
      local_34 = snprintf_float<long_double>(value,precision,specs,buf);
    }
  }
  return local_34;
}

Assistant:

FMT_HEADER_ONLY_CONSTEXPR20 int format_float(Float value, int precision,
                                             float_specs specs,
                                             buffer<char>& buf) {
  // float is passed as double to reduce the number of instantiations.
  static_assert(!std::is_same<Float, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.try_resize(to_unsigned(precision));
    fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (specs.fallback) return snprintf_float(value, precision, specs, buf);

  if (!is_constant_evaluated() && precision < 0) {
    // Use Dragonbox for the shortest format.
    if (specs.binary32) {
      auto dec = dragonbox::to_decimal(static_cast<float>(value));
      write<char>(buffer_appender<char>(buf), dec.significand);
      return dec.exponent;
    }
    auto dec = dragonbox::to_decimal(static_cast<double>(value));
    write<char>(buffer_appender<char>(buf), dec.significand);
    return dec.exponent;
  }

  int exp = 0;
  bool use_dragon = true;
  if (is_fast_float<Float>()) {
    // Use Grisu + Dragon4 for the given precision:
    // https://www.cs.tufts.edu/~nr/cs257/archive/florian-loitsch/printf.pdf.
    const int min_exp = -60;  // alpha in Grisu.
    int cached_exp10 = 0;     // K in Grisu.
    fp normalized = normalize(fp(value));
    const auto cached_pow = get_cached_power(
        min_exp - (normalized.e + fp::num_significand_bits), cached_exp10);
    normalized = normalized * cached_pow;
    gen_digits_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
    if (grisu_gen_digits(normalized, 1, exp, handler) != digits::error &&
        !is_constant_evaluated()) {
      exp += handler.exp10;
      buf.try_resize(to_unsigned(handler.size));
      use_dragon = false;
    } else {
      exp += handler.size - cached_exp10 - 1;
      precision = handler.precision;
    }
  }
  if (use_dragon) {
    auto f = fp();
    bool is_predecessor_closer =
        specs.binary32 ? f.assign(static_cast<float>(value)) : f.assign(value);
    // Limit precision to the maximum possible number of significant digits in
    // an IEEE754 double because we don't need to generate zeros.
    const int max_double_digits = 767;
    if (precision > max_double_digits) precision = max_double_digits;
    format_dragon(f, is_predecessor_closer, precision, buf, exp);
  }
  if (!fixed && !specs.showpoint) {
    // Remove trailing zeros.
    auto num_digits = buf.size();
    while (num_digits > 0 && buf[num_digits - 1] == '0') {
      --num_digits;
      ++exp;
    }
    buf.try_resize(num_digits);
  }
  return exp;
}